

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cave-square.c
# Opt level: O3

_Bool square_isbelievedwall(chunk_conflict *c,loc grid)

{
  _Bool _Var1;
  bool bVar2;
  
  _Var1 = square_in_bounds_fully(c,grid);
  bVar2 = true;
  if (_Var1) {
    _Var1 = square_isknown(c,grid);
    if (_Var1) {
      _Var1 = square_isprojectable((chunk_conflict *)player->cave,grid);
      bVar2 = !_Var1;
    }
    else {
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

bool square_isbelievedwall(struct chunk *c, struct loc grid)
{
	// the edge of the world is definitely gonna block things
	if (!square_in_bounds_fully(c, grid)) return true;
	// if we dont know assume its projectable
	if (!square_isknown(c, grid)) return false;
	// report what we think (we may be wrong)
	return !square_isprojectable(player->cave, grid);
}